

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bddisasm_crt.c
# Opt level: O0

char * nd_strcat_s(char *dst,ND_SIZET dst_size,char *src)

{
  char cVar1;
  bool bVar2;
  ND_SIZET local_38;
  ND_SIZET available;
  char *p;
  char *src_local;
  ND_SIZET dst_size_local;
  char *dst_local;
  
  local_38 = dst_size;
  available = (ND_SIZET)dst;
  while( true ) {
    bVar2 = false;
    if (local_38 != 0) {
      bVar2 = *(char *)available != '\0';
    }
    if (!bVar2) break;
    available = available + 1;
    local_38 = local_38 - 1;
  }
  p = src;
  if (local_38 == 0) {
    nd_memset(dst,0,dst_size);
    dst_local = (char *)0x0;
  }
  else {
    do {
      cVar1 = *p;
      *(char *)available = cVar1;
      bVar2 = false;
      if (cVar1 != '\0') {
        local_38 = local_38 - 1;
        bVar2 = local_38 != 0;
      }
      available = available + 1;
      p = p + 1;
    } while (bVar2);
    dst_local = dst;
    if (local_38 == 0) {
      nd_memset(dst,0,dst_size);
      dst_local = (char *)0x0;
    }
  }
  return dst_local;
}

Assistant:

char *
nd_strcat_s(
    char *dst,
    ND_SIZET dst_size,
    const char *src
    )
{
    char *p;
    ND_SIZET available;

    p = dst;
    available = dst_size;
    while (available > 0 && *p != 0)
    {
        p++;
        available--;
    }

    if (available == 0)
    {
        nd_memzero(dst, dst_size);
        return (char *)ND_NULL;
    }

    while ((*p++ = *src++) != 0 && --available > 0);

    if (available == 0)
    {
        nd_memzero(dst, dst_size);
        return (char *)ND_NULL;
    }

    return dst;
}